

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tbl.hpp
# Opt level: O0

bool __thiscall
Tbl::Table<std::allocator<char>_>::ReadRow
          (Table<std::allocator<char>_> *this,string_view text,const_iterator *current,
          char delimiter,Format format)

{
  const_iterator pvVar1;
  string_view text_00;
  string_view text_01;
  undefined8 uVar2;
  bool bVar3;
  const_iterator pvVar4;
  size_t sVar5;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar6;
  int local_10c;
  TableData local_108;
  value_type local_e0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_b8;
  undefined1 local_b0;
  size_type local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_90;
  Table<std::allocator<char>_> *local_68;
  size_t local_60;
  undefined1 local_58 [8];
  String str;
  size_t column;
  Format format_local;
  char delimiter_local;
  const_iterator *current_local;
  Table<std::allocator<char>_> *this_local;
  string_view text_local;
  
  text_local._M_len = (size_t)text._M_str;
  this_local = (Table<std::allocator<char>_> *)text._M_len;
  str.field_2._8_8_ = 0;
  do {
    pvVar1 = *current;
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (pvVar1 == pvVar4) break;
    local_68 = this_local;
    local_60 = text_local._M_len;
    text_01._M_str = (char *)text_local._M_len;
    text_01._M_len = (size_t)this_local;
    Table<std::allocator<char>>::ParseCell_abi_cxx11_
              ((String *)local_58,(Table<std::allocator<char>> *)this,text_01,delimiter,current);
    if (str.field_2._8_8_ == 0) {
      local_98 = std::
                 unordered_map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::size(&this->m_rowMap);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long,_true>
                (&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_98);
      pVar6 = std::
              unordered_map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::insert(&this->m_rowMap,&local_90);
      local_b8._M_cur =
           (__node_type *)
           pVar6.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
           ._M_cur;
      local_b0 = pVar6.second;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::~pair(&local_90);
      std::variant<long,double,std::__cxx11::string>::
      variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                ((variant<long,double,std::__cxx11::string> *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::
      vector<std::variant<long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(&this->m_tableData,&local_e0);
      std::
      variant<long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant(&local_e0);
    }
    else {
      ParseData(&local_108,this,(String *)local_58,format);
      std::
      vector<std::variant<long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(&this->m_tableData,&local_108);
      std::
      variant<long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant(&local_108);
    }
    str.field_2._8_8_ = str.field_2._8_8_ + 1;
    pvVar1 = *current;
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if ((pvVar1 == pvVar4) || (bVar3 = IsLineEnd(this,*current), bVar3)) {
      local_10c = 3;
    }
    else {
      *current = *current + 1;
      local_10c = 0;
    }
    std::__cxx11::string::~string((string *)local_58);
  } while (local_10c == 0);
  text_00._M_str = (char *)text_local._M_len;
  text_00._M_len = (size_t)this_local;
  AdvanceToNextLine(this,text_00,current);
  uVar2 = str.field_2._8_8_;
  sVar5 = GetNumColumns(this);
  return uVar2 == sVar5;
}

Assistant:

bool ReadRow(std::string_view text, std::string_view::const_iterator & current, char delimiter, Format format)
		{
			// Track column data
			size_t column = 0;
			while (current != text.end())
			{
				auto str = ParseCell(text, delimiter, current);
				if (column == 0)
				{
					m_rowMap.insert({ str, m_rowMap.size() });
					m_tableData.push_back(str);
				}
				else
					m_tableData.push_back(ParseData(str, format));
				++column;
				if (current == text.end() || IsLineEnd(current))
					break;
				++current;
			}
			AdvanceToNextLine(text, current);
			return column == GetNumColumns();
		}